

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O3

curl_llist * Curl_llist_alloc(curl_llist_dtor dtor)

{
  curl_llist *pcVar1;
  
  pcVar1 = (curl_llist *)(*Curl_cmalloc)(0x20);
  if (pcVar1 != (curl_llist *)0x0) {
    pcVar1->size = 0;
    pcVar1->dtor = dtor;
    pcVar1->head = (curl_llist_element *)0x0;
    pcVar1->tail = (curl_llist_element *)0x0;
  }
  return pcVar1;
}

Assistant:

struct curl_llist *
Curl_llist_alloc(curl_llist_dtor dtor)
{
  struct curl_llist *list;

  list = malloc(sizeof(struct curl_llist));
  if(!list)
    return NULL;

  llist_init(list, dtor);

  return list;
}